

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dll.c
# Opt level: O3

void nsync_dll_splice_after_(nsync_dll_element_ *p,nsync_dll_element_ *n)

{
  nsync_dll_element_s_ *pnVar1;
  nsync_dll_element_s_ *pnVar2;
  
  pnVar1 = p->next;
  pnVar2 = n->prev;
  p->next = n;
  n->prev = p;
  pnVar2->next = pnVar1;
  pnVar1->prev = pnVar2;
  return;
}

Assistant:

void nsync_dll_splice_after_ (nsync_dll_element_ *p, nsync_dll_element_ *n) {
        nsync_dll_element_ *p_2nd = p->next;
        nsync_dll_element_ *n_last = n->prev;
        p->next = n;  /* n follows p */
        n->prev = p;
	n_last->next = p_2nd;  /* remainder of p-list follows last of n-list */
	p_2nd->prev = n_last;
}